

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BayesianProbitRegressor::InternalSwap
          (BayesianProbitRegressor *this,BayesianProbitRegressor *other)

{
  uint32 uVar1;
  int iVar2;
  string *psVar3;
  BayesianProbitRegressor_Gaussian *pBVar4;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->features_).super_RepeatedPtrFieldBase,
             &(other->features_).super_RepeatedPtrFieldBase);
  psVar3 = (this->regressioninputfeaturename_).ptr_;
  (this->regressioninputfeaturename_).ptr_ = (other->regressioninputfeaturename_).ptr_;
  (other->regressioninputfeaturename_).ptr_ = psVar3;
  psVar3 = (this->optimisminputfeaturename_).ptr_;
  (this->optimisminputfeaturename_).ptr_ = (other->optimisminputfeaturename_).ptr_;
  (other->optimisminputfeaturename_).ptr_ = psVar3;
  psVar3 = (this->samplingscaleinputfeaturename_).ptr_;
  (this->samplingscaleinputfeaturename_).ptr_ = (other->samplingscaleinputfeaturename_).ptr_;
  (other->samplingscaleinputfeaturename_).ptr_ = psVar3;
  psVar3 = (this->samplingtruncationinputfeaturename_).ptr_;
  (this->samplingtruncationinputfeaturename_).ptr_ =
       (other->samplingtruncationinputfeaturename_).ptr_;
  (other->samplingtruncationinputfeaturename_).ptr_ = psVar3;
  psVar3 = (this->meanoutputfeaturename_).ptr_;
  (this->meanoutputfeaturename_).ptr_ = (other->meanoutputfeaturename_).ptr_;
  (other->meanoutputfeaturename_).ptr_ = psVar3;
  psVar3 = (this->varianceoutputfeaturename_).ptr_;
  (this->varianceoutputfeaturename_).ptr_ = (other->varianceoutputfeaturename_).ptr_;
  (other->varianceoutputfeaturename_).ptr_ = psVar3;
  psVar3 = (this->pessimisticprobabilityoutputfeaturename_).ptr_;
  (this->pessimisticprobabilityoutputfeaturename_).ptr_ =
       (other->pessimisticprobabilityoutputfeaturename_).ptr_;
  (other->pessimisticprobabilityoutputfeaturename_).ptr_ = psVar3;
  psVar3 = (this->sampledprobabilityoutputfeaturename_).ptr_;
  (this->sampledprobabilityoutputfeaturename_).ptr_ =
       (other->sampledprobabilityoutputfeaturename_).ptr_;
  (other->sampledprobabilityoutputfeaturename_).ptr_ = psVar3;
  pBVar4 = this->bias_;
  this->bias_ = other->bias_;
  other->bias_ = pBVar4;
  uVar1 = this->numberoffeatures_;
  this->numberoffeatures_ = other->numberoffeatures_;
  other->numberoffeatures_ = uVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void BayesianProbitRegressor::InternalSwap(BayesianProbitRegressor* other) {
  features_.InternalSwap(&other->features_);
  regressioninputfeaturename_.Swap(&other->regressioninputfeaturename_);
  optimisminputfeaturename_.Swap(&other->optimisminputfeaturename_);
  samplingscaleinputfeaturename_.Swap(&other->samplingscaleinputfeaturename_);
  samplingtruncationinputfeaturename_.Swap(&other->samplingtruncationinputfeaturename_);
  meanoutputfeaturename_.Swap(&other->meanoutputfeaturename_);
  varianceoutputfeaturename_.Swap(&other->varianceoutputfeaturename_);
  pessimisticprobabilityoutputfeaturename_.Swap(&other->pessimisticprobabilityoutputfeaturename_);
  sampledprobabilityoutputfeaturename_.Swap(&other->sampledprobabilityoutputfeaturename_);
  std::swap(bias_, other->bias_);
  std::swap(numberoffeatures_, other->numberoffeatures_);
  std::swap(_cached_size_, other->_cached_size_);
}